

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

size_t Output::VTrace(char16 *shortPrefixFormat,char16 *prefix,char16 *form,__va_list_tag *argptr)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  WCHAR local_218 [4];
  char16 callStackMsg [182];
  void *frames [10];
  char16 callStackPrefix [12];
  
  sVar5 = Print(shortPrefixFormat);
  sVar6 = VPrint(form,argptr);
  sVar6 = sVar6 + sVar5;
  if (s_stackTraceHelper != (IStackTraceHelper *)0x0) {
    frames[9]._0_2_ = L'c';
    frames[9]._2_2_ = L'a';
    frames[9]._4_2_ = L'l';
    frames[9]._6_2_ = L'l';
    if (s_inMemoryLogger == (ILogger *)0x0) {
      sVar5 = Print(L"%s\n",frames + 9);
      iVar3 = (**s_stackTraceHelper->_vptr_IStackTraceHelper)(s_stackTraceHelper,2,10);
      return CONCAT44(extraout_var,iVar3) + sVar5 + sVar6;
    }
    iVar3 = _snwprintf_unsafe(local_218,0xb6,0xffffffffffffffff,L"%s",frames + 9);
    if (iVar3 == -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                         ,0xc3,"(temp != -1)","temp != -1");
      if (!bVar2) goto LAB_0035738f;
      *puVar7 = 0;
    }
    uVar4 = (*s_stackTraceHelper->_vptr_IStackTraceHelper[1])
                      (s_stackTraceHelper,2,10,callStackMsg + 0xb4);
    if (uVar4 < 0xb) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                         ,199,"(framesObtained <= c_frameCount)","framesObtained <= c_frameCount");
      if (!bVar2) {
LAB_0035738f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    uVar8 = (ulong)iVar3;
    uVar10 = 10;
    if (uVar4 < 10) {
      uVar10 = (ulong)uVar4;
    }
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      if (0xb6 < uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                           ,0xca,"((sizeof(*__countof_helper(callStackMsg)) + 0) >= start)",
                           "_countof(callStackMsg) >= start");
        if (!bVar2) goto LAB_0035738f;
        *puVar7 = 0;
      }
      iVar3 = _snwprintf_unsafe(callStackMsg + (uVar8 - 4),0xb6 - uVar8,0xffffffffffffffff,L" %p",
                                *(undefined8 *)(callStackMsg + uVar9 * 4 + 0xb4));
      if (iVar3 == -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                           ,0xcc,"(temp != -1)","temp != -1");
        if (!bVar2) goto LAB_0035738f;
        *puVar7 = 0;
      }
      uVar8 = uVar8 + (long)iVar3;
    }
    sVar5 = Print(L"%s\n",local_218);
    sVar6 = sVar6 + sVar5;
  }
  return sVar6;
}

Assistant:

size_t
Output::VTrace(const char16* shortPrefixFormat, const char16* prefix, const char16 *form, va_list argptr)
{
    size_t retValue = 0;

#if CONFIG_RICH_TRACE_FORMAT
    if (CONFIG_FLAG(RichTraceFormat))
    {
        InterlockedIncrement(&s_traceEntryId);
        retValue += Output::Print(_u("[%d ~%d %s] "), s_traceEntryId, ::GetCurrentThreadId(), prefix);
    }
    else
#endif
    {
        retValue += Output::Print(shortPrefixFormat, prefix);
    }
    retValue += Output::VPrint(form, argptr);

#ifdef STACK_BACK_TRACE
    // Print stack trace.
    if (s_stackTraceHelper)
    {
        const ULONG c_framesToSkip = 2; // Skip 2 frames -- Output::VTrace and Output::Trace.
        const ULONG c_frameCount = 10;  // TODO: make it configurable.
        const char16 callStackPrefix[] = _u("call stack:");
        if (s_inMemoryLogger)
        {
            // Trace just addresses of functions, avoid symbol info as it takes too much memory.
            // One line for whole stack trace for easier parsing on the jd side.
            const size_t c_msgCharCount = _countof(callStackPrefix) + (1 + sizeof(void*) * 2) * c_frameCount; // 2 hexadecimal digits per byte + 1 for space.
            char16 callStackMsg[c_msgCharCount];
            void* frames[c_frameCount];
            size_t start = 0;
            size_t temp;

            temp = _snwprintf_s(callStackMsg, _countof(callStackMsg), _TRUNCATE, _u("%s"), callStackPrefix);
            Assert(temp != -1);
            start += temp;

            ULONG framesObtained = s_stackTraceHelper->GetStackTrace(c_framesToSkip, c_frameCount, frames);
            Assert(framesObtained <= c_frameCount);
            for (ULONG i = 0; i < framesObtained && i < c_frameCount; ++i)
            {
                Assert(_countof(callStackMsg) >= start);
                temp = _snwprintf_s(callStackMsg + start, _countof(callStackMsg) - start, _TRUNCATE, _u(" %p"), frames[i]);
                Assert(temp != -1);
                start += temp;
            }

            retValue += Output::Print(_u("%s\n"), callStackMsg);
        }
        else
        {
            // Trace with full symbol info.
            retValue += Output::Print(_u("%s\n"), callStackPrefix);
            retValue += s_stackTraceHelper->PrintStackTrace(c_framesToSkip, c_frameCount);
        }
    }
#endif

    return retValue;
}